

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_utils.cpp
# Opt level: O0

void libtorrent::aux::create_symlink(string *target,string *link,storage_error *ec)

{
  undefined4 val;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *__to;
  int *piVar4;
  error_category *peVar5;
  error_code local_2b0;
  error_code local_2a0;
  basic_string_view<char,_std::char_traits<char>_> local_290;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_280;
  size_type local_270;
  ssize_t ret;
  char buffer [512];
  undefined1 auStack_60 [4];
  int error;
  error_category *local_58;
  string local_40;
  storage_error *local_20;
  storage_error *ec_local;
  string *link_local;
  string *target_local;
  
  local_20 = ec;
  ec_local = (storage_error *)link;
  link_local = target;
  parent_path(&local_40,link);
  create_directories(&local_40,&local_20->ec);
  ::std::__cxx11::string::~string((string *)&local_40);
  bVar1 = storage_error::operator_cast_to_bool(local_20);
  if (bVar1) {
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    peVar5 = boost::system::generic_category();
    boost::system::error_code::error_code((error_code *)auStack_60,iVar2,peVar5);
    (local_20->ec).val_ = (int)auStack_60;
    (local_20->ec).failed_ = error._0_1_;
    *(undefined3 *)&(local_20->ec).field_0x5 = error._1_3_;
    (local_20->ec).cat_ = local_58;
    local_20->operation = mkdir;
  }
  else {
    pcVar3 = (char *)::std::__cxx11::string::c_str();
    __to = (char *)::std::__cxx11::string::c_str();
    iVar2 = symlink(pcVar3,__to);
    if (iVar2 != 0) {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      buffer._508_4_ = iVar2;
      if (iVar2 == 0x11) {
        pcVar3 = (char *)::std::__cxx11::string::c_str();
        local_270 = readlink(pcVar3,(char *)&ret,0x200);
        if (0 < (long)local_270) {
          local_280 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                      ::std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)link_local);
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_290,(char *)&ret,local_270);
          bVar1 = ::std::operator!=(local_280,local_290);
          if (!bVar1) {
            return;
          }
        }
        val = buffer._508_4_;
        peVar5 = boost::system::generic_category();
        boost::system::error_code::error_code(&local_2a0,val,peVar5);
        (local_20->ec).val_ = local_2a0.val_;
        (local_20->ec).failed_ = local_2a0.failed_;
        *(undefined3 *)&(local_20->ec).field_0x5 = local_2a0._5_3_;
        (local_20->ec).cat_ = local_2a0.cat_;
        local_20->operation = symlink;
      }
      else {
        peVar5 = boost::system::generic_category();
        boost::system::error_code::error_code(&local_2b0,iVar2,peVar5);
        (local_20->ec).val_ = local_2b0.val_;
        (local_20->ec).failed_ = local_2b0.failed_;
        *(undefined3 *)&(local_20->ec).field_0x5 = local_2b0._5_3_;
        (local_20->ec).cat_ = local_2b0.cat_;
        local_20->operation = symlink;
      }
    }
  }
  return;
}

Assistant:

void create_symlink(std::string const& target, std::string const& link, storage_error& ec)
	{
#if TORRENT_HAS_SYMLINK
		create_directories(parent_path(link), ec.ec);
		if (ec)
		{
			ec.ec = error_code(errno, generic_category());
			ec.operation = operation_t::mkdir;
			return;
		}
		if (::symlink(target.c_str(), link.c_str()) != 0)
		{
			int const error = errno;
			if (error == EEXIST)
			{
				// if the file exist, it may be a symlink already. if so,
				// just verify the link target is what it's supposed to be
				// note that readlink() does not null terminate the buffer
				char buffer[512];
				auto const ret = ::readlink(link.c_str(), buffer, sizeof(buffer));
				if (ret <= 0 || target != string_view(buffer, std::size_t(ret)))
				{
					ec.ec = error_code(error, generic_category());
					ec.operation = operation_t::symlink;
					return;
				}
			}
			else
			{
				ec.ec = error_code(error, generic_category());
				ec.operation = operation_t::symlink;
				return;
			}
		}
#else
		TORRENT_UNUSED(target);
		TORRENT_UNUSED(link);
		TORRENT_UNUSED(ec);
#endif
	}